

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool art_internal_validate(art_t *art,char **reason,art_validate_cb_t validate_cb,void *context)

{
  art_internal_validate_t validator_00;
  _Bool _Var1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char **in_RSI;
  long *in_RDI;
  uint64_t first_free;
  uint64_t i;
  uint64_t capacity;
  art_typecode_t type;
  art_internal_validate_t validator;
  char *reason_local;
  undefined1 *local_80;
  art_t *in_stack_ffffffffffffff90;
  art_t *in_stack_ffffffffffffff98;
  byte local_59;
  char **local_58;
  uint in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  char **local_18;
  _Bool local_1;
  
  local_18 = in_RSI;
  if (in_RSI == (char **)0x0) {
    local_18 = (char **)&stack0xffffffffffffffd0;
  }
  *local_18 = (char *)0x0;
  if (*in_RDI == 0) {
    local_1 = true;
  }
  else {
    local_58 = local_18;
    local_80 = &stack0xffffffffffffffc5;
    do {
      *local_80 = 0;
      local_80 = local_80 + 1;
    } while (local_80 != &stack0xffffffffffffffca);
    for (local_59 = 1; local_59 < 6; local_59 = local_59 + 1) {
      in_stack_ffffffffffffff98 = (art_t *)in_RDI[(ulong)local_59 + 7];
      for (in_stack_ffffffffffffff90 = (art_t *)0x0;
          in_stack_ffffffffffffff90 < in_stack_ffffffffffffff98;
          in_stack_ffffffffffffff90 = (art_t *)((long)&in_stack_ffffffffffffff90->root + 1)) {
        if (in_stack_ffffffffffffff98 < (art_t *)in_RDI[(ulong)local_59 + 1]) {
          _Var1 = art_validate_fail((art_internal_validate_t *)&local_58,"first_free > capacity");
          return _Var1;
        }
      }
    }
    validator_00.validate_cb = (art_validate_cb_t)in_RCX;
    validator_00.reason = (char **)in_RDX;
    validator_00.context._0_4_ = 0;
    validator_00.context._4_4_ = in_stack_ffffffffffffffc4 & 0xffffff00;
    validator_00._24_8_ = in_stack_ffffffffffffffc8;
    validator_00.current_key[4] = (char)in_stack_ffffffffffffffd0;
    validator_00.current_key[5] = (char)((ulong)in_stack_ffffffffffffffd0 >> 8);
    validator_00._34_6_ = (int6)((ulong)in_stack_ffffffffffffffd0 >> 0x10);
    local_1 = art_internal_validate_at
                        (in_stack_ffffffffffffff98,(art_ref_t)in_stack_ffffffffffffff90,validator_00
                        );
  }
  return local_1;
}

Assistant:

bool art_internal_validate(const art_t *art, const char **reason,
                           art_validate_cb_t validate_cb, void *context) {
    const char *reason_local;
    if (reason == NULL) {
        // Always allow assigning through *reason
        reason = &reason_local;
    }
    *reason = NULL;
    if (art->root == CROARING_ART_NULL_REF) {
        return true;
    }
    art_internal_validate_t validator = {
        .reason = reason,
        .validate_cb = validate_cb,
        .context = context,
        .depth = 0,
        .current_key = CROARING_ZERO_INITIALIZER,
    };
    for (art_typecode_t type = CROARING_ART_LEAF_TYPE;
         type <= CROARING_ART_NODE256_TYPE; ++type) {
        uint64_t capacity = art->capacities[type];
        for (uint64_t i = 0; i < capacity; ++i) {
            uint64_t first_free = art->first_free[type];
            if (first_free > capacity) {
                return art_validate_fail(&validator, "first_free > capacity");
            }
        }
    }
    return art_internal_validate_at(art, art->root, validator);
}